

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[24],kj::StringPtr>
          (String *__return_storage_ptr__,kj *this,char (*params) [24],StringPtr *params_1)

{
  ArrayPtr<const_char> local_30;
  ArrayPtr<const_char> local_20;
  
  local_20 = toCharSequence<char_const(&)[24]>((char (*) [24])this);
  local_30.ptr = *(char **)*params;
  local_30.size_ = *(long *)(*params + 8) + -1;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_20,&local_30,(ArrayPtr<const_char> *)local_30.size_)
  ;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}